

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  TreeNode *this;
  Solution *this_00;
  ListNode *this_01;
  allocator local_219;
  ListNode l2;
  string t3String;
  string t2String;
  string local_1c8;
  string local_1a8;
  ListNode l1;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string t1String;
  string local_d8;
  string test;
  TreeNode t1;
  TreeNode root;
  TreeNode t3;
  TreeNode t2;
  
  std::__cxx11::string::string
            ((string *)&test,"[1,2,3,4,5,6,7,8,9,null,10,11,null,12]",(allocator *)&root);
  std::__cxx11::string::string((string *)&local_d8,(string *)&test);
  TreeNode::TreeNode(&root,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string((string *)&t1String,"[1,2,3,4]",(allocator *)&t2String);
  std::__cxx11::string::string((string *)&t2String,"[2,1,3,null,4,null,7]",(allocator *)&t3String);
  std::__cxx11::string::string((string *)&t3String,"[1,2,3,null,4]",(allocator *)&t1);
  std::__cxx11::string::string((string *)&local_118,(string *)&t1String);
  TreeNode::TreeNode(&t1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::string((string *)&local_138,(string *)&t2String);
  TreeNode::TreeNode(&t2,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::string((string *)&local_158,(string *)&t3String);
  TreeNode::TreeNode(&t3,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  this = (TreeNode *)operator_new(0x20);
  std::__cxx11::string::string((string *)&local_178,(string *)&t3String);
  TreeNode::TreeNode(this,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::string((string *)&local_1a8,"[5]",(allocator *)&l2);
  ListNode::ListNode(&l1,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::string((string *)&local_1c8,"[5,5]",&local_219);
  ListNode::ListNode(&l2,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  this_00 = (Solution *)operator_new(1);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  this_01 = Solution::addTwoNumbers(this_00,&l1,&l2);
  TreeNode::destroy(this);
  if (this_01 != (ListNode *)0x0) {
    ListNode::traverse(this_01);
  }
  ListNode::destory(this_01);
  operator_delete(this_00);
  std::__cxx11::string::~string((string *)&t3String);
  std::__cxx11::string::~string((string *)&t2String);
  std::__cxx11::string::~string((string *)&t1String);
  std::__cxx11::string::~string((string *)&test);
  return 0;
}

Assistant:

int main() {
    string test = "[1,2,3,4,5,6,7,8,9,null,10,11,null,12]";
    TreeNode root(test);

    string t1String = "[1,2,3,4]";
    string t2String = "[2,1,3,null,4,null,7]";
    string t3String = "[1,2,3,null,4]";
    TreeNode t1(t1String);
    TreeNode t2(t2String);
    TreeNode t3(t3String);
    TreeNode *t4 = new TreeNode(t3String);

    ListNode l1("[5]");
    ListNode l2("[5,5]");


    Solution *s = new Solution();
    cout << endl;
    ListNode *r = s->addTwoNumbers(&l1, &l2);


    t4->destroy();
    if (r != NULL) {
        r->traverse();
    }
    r->destory();
    delete s;

}